

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O2

bson_t * bson_sized_new(size_t size)

{
  bson_t *bson;
  undefined1 *puVar1;
  
  if (size >> 0x1f == 0) {
    bson = (bson_t *)bson_malloc(0x80);
    if (size < 0x79) {
      bson_init(bson);
      *(byte *)&bson->flags = (byte)bson->flags & 0xfd;
    }
    else {
      bson->flags = 0;
      bson->len = 5;
      bson->padding[0] = '\0';
      bson->padding[1] = '\0';
      bson->padding[2] = '\0';
      bson->padding[3] = '\0';
      bson->padding[4] = '\0';
      bson->padding[5] = '\0';
      bson->padding[6] = '\0';
      bson->padding[7] = '\0';
      bson->padding[8] = '\0';
      bson->padding[9] = '\0';
      bson->padding[10] = '\0';
      bson->padding[0xb] = '\0';
      *(uint8_t **)(bson->padding + 0x10) = bson->padding + 0x28;
      *(uint8_t **)(bson->padding + 0x18) = bson->padding + 0x30;
      bson->padding[0x20] = '\0';
      bson->padding[0x21] = '\0';
      bson->padding[0x22] = '\0';
      bson->padding[0x23] = '\0';
      bson->padding[0x24] = '\0';
      bson->padding[0x25] = '\0';
      bson->padding[0x26] = '\0';
      bson->padding[0x27] = '\0';
      *(size_t *)(bson->padding + 0x30) = size;
      puVar1 = (undefined1 *)bson_malloc(size);
      *(undefined1 **)(bson->padding + 0x28) = puVar1;
      *puVar1 = 5;
      *(undefined1 *)(*(long *)(bson->padding + 0x28) + 1) = 0;
      *(undefined1 *)(*(long *)(bson->padding + 0x28) + 2) = 0;
      *(undefined1 *)(*(long *)(bson->padding + 0x28) + 3) = 0;
      *(undefined1 *)(*(long *)(bson->padding + 0x28) + 4) = 0;
      *(code **)(bson->padding + 0x38) = bson_realloc_ctx;
      bson->padding[0x40] = '\0';
      bson->padding[0x41] = '\0';
      bson->padding[0x42] = '\0';
      bson->padding[0x43] = '\0';
      bson->padding[0x44] = '\0';
      bson->padding[0x45] = '\0';
      bson->padding[0x46] = '\0';
      bson->padding[0x47] = '\0';
    }
    return bson;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
          0x7f4,"bson_sized_new","size <= INT32_MAX");
  abort();
}

Assistant:

bson_t *
bson_sized_new (size_t size)
{
   bson_impl_alloc_t *impl_a;
   bson_t *b;

   BSON_ASSERT (size <= INT32_MAX);

   b = bson_malloc (sizeof *b);
   impl_a = (bson_impl_alloc_t *) b;

   if (size <= BSON_INLINE_DATA_SIZE) {
      bson_init (b);
      b->flags &= ~BSON_FLAG_STATIC;
   } else {
      impl_a->flags = BSON_FLAG_NONE;
      impl_a->len = 5;
      impl_a->parent = NULL;
      impl_a->depth = 0;
      impl_a->buf = &impl_a->alloc;
      impl_a->buflen = &impl_a->alloclen;
      impl_a->offset = 0;
      impl_a->alloclen = BSON_MAX (5, size);
      impl_a->alloc = bson_malloc (impl_a->alloclen);
      impl_a->alloc[0] = 5;
      impl_a->alloc[1] = 0;
      impl_a->alloc[2] = 0;
      impl_a->alloc[3] = 0;
      impl_a->alloc[4] = 0;
      impl_a->realloc = bson_realloc_ctx;
      impl_a->realloc_func_ctx = NULL;
   }

   return b;
}